

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writefile.cpp
# Opt level: O2

void __thiscall WriteFile::WriteUnbuffered(WriteFile *this,char *data,size_t writeSize)

{
  ssize_t sVar1;
  int *piVar2;
  
  do {
    while( true ) {
      if (writeSize == 0) {
        return;
      }
      sVar1 = write(this->m_fd,data,writeSize);
      if (sVar1 < 0) break;
      writeSize = writeSize - sVar1;
      data = data + sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return;
}

Assistant:

void WriteFile::WriteUnbuffered(const char * data, size_t writeSize)
{
	while(0 < writeSize)
	{
		ssize_t nWriten = write(m_fd, data, writeSize);
		if (0 > nWriten)
		{
			// retry
			if (EINTR == errno)
			{
				continue;
			}
			return;
		}
		
		writeSize -= nWriten;
		data += nWriten;
	}
}